

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O0

void __thiscall
QLoggingRegistry::registerCategory
          (QLoggingRegistry *this,QLoggingCategory *cat,QtMsgType enableForLevel)

{
  long lVar1;
  undefined8 in_RSI;
  QHash<QLoggingCategory_*,_QtMsgType> *in_RDI;
  long in_FS_OFFSET;
  scoped_lock<QMutex> locker;
  TryEmplaceResult r;
  QMutex *in_stack_ffffffffffffff88;
  QtMsgType *in_stack_ffffffffffffff90;
  QLoggingCategory **key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key = (QLoggingCategory **)&DAT_aaaaaaaaaaaaaaaa;
  (anonymous_namespace)::qt_scoped_lock<QMutex,std::scoped_lock<QMutex>>(in_stack_ffffffffffffff88);
  QHash<QLoggingCategory*,QtMsgType>::tryEmplace<QtMsgType&>(in_RDI,key,in_stack_ffffffffffffff90);
  if (((ulong)key & 1) != 0) {
    (*(code *)in_RDI[0xe].d)(in_RSI);
  }
  std::scoped_lock<QMutex>::~scoped_lock((scoped_lock<QMutex> *)0x2d5804);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLoggingRegistry::registerCategory(QLoggingCategory *cat, QtMsgType enableForLevel)
{
    const auto locker = qt_scoped_lock(registryMutex);

    auto r = categories.tryEmplace(cat, enableForLevel);
    if (r.inserted) {
        // new entry
        (*categoryFilter)(cat);
    }
}